

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall
spectest::CommandRunner::ReadMalformedModule
          (CommandRunner *this,int line_number,string_view module_filename,ModuleType module_type,
          char *desc)

{
  Result RVar1;
  CommandRunner *this_00;
  string header;
  Errors errors;
  
  this_00 = (CommandRunner *)&header;
  wabt::StringPrintf_abi_cxx11_
            ((string *)this_00,"%s:%d: %s passed",(this->source_filename_)._M_dataplus._M_p,
             line_number);
  if (module_type == Binary) {
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    RVar1 = ReadMalformedBinaryModule(this_00,module_filename,&errors);
    wabt::FormatErrorsToFile(&errors,Binary,(LexerSourceLineFinder *)0x0,_stdout,&header,Once,0x50);
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&errors);
  }
  else {
    if (module_type != Text) {
      abort();
    }
    RVar1 = ReadTextModule(this_00,module_filename,&header,false);
  }
  std::__cxx11::string::_M_dispose();
  return (Result)RVar1.enum_;
}

Assistant:

wabt::Result CommandRunner::ReadMalformedModule(
    int line_number,
    std::string_view module_filename,
    ModuleType module_type,
    const char* desc) {
  std::string header = StringPrintf(
      "%s:%d: %s passed", source_filename_.c_str(), line_number, desc);

  switch (module_type) {
    case ModuleType::Text: {
      return ReadTextModule(module_filename, header, false);
    }

    case ModuleType::Binary: {
      Errors errors;
      wabt::Result result = ReadMalformedBinaryModule(module_filename, &errors);
      FormatErrorsToFile(errors, Location::Type::Binary, {}, stdout, header,
                         PrintHeader::Once);
      return result;
    }
  }

  WABT_UNREACHABLE;
}